

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgesturemanager.cpp
# Opt level: O0

bool __thiscall
QGestureManager::filterEvent(QGestureManager *this,QGraphicsObject *receiver,QEvent *event)

{
  long lVar1;
  bool bVar2;
  byte bVar3;
  QGraphicsObject *key;
  QMultiMap<QObject_*,_Qt::GestureType> *in_RDX;
  QObject **in_RSI;
  long in_FS_OFFSET;
  QGraphicsObject *item;
  ContextIterator e_1;
  ContextIterator it_1;
  ContextIterator e;
  ContextIterator it;
  QMultiMap<QObject_*,_Qt::GestureType> contexts;
  QVarLengthArray<Qt::GestureType,_16LL> types;
  undefined4 in_stack_ffffffffffffff18;
  GestureFlag in_stack_ffffffffffffff1c;
  undefined6 in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffff26;
  undefined1 in_stack_ffffffffffffff27;
  undefined1 uVar4;
  iterator in_stack_ffffffffffffff30;
  iterator in_stack_ffffffffffffff38;
  QFlagsStorageHelper<Qt::GestureFlag,_4> local_94;
  const_iterator local_90;
  const_iterator local_88;
  const_iterator local_78;
  const_iterator local_70;
  undefined1 *local_68;
  undefined1 local_60 [24];
  QEvent *in_stack_ffffffffffffffb8;
  QMultiMap<QObject_*,_Qt::GestureType> *in_stack_ffffffffffffffc0;
  QGestureManager *in_stack_ffffffffffffffc8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  memset(local_60,0xaa,0x58);
  QVarLengthArray<Qt::GestureType,_16LL>::QVarLengthArray
            ((QVarLengthArray<Qt::GestureType,_16LL> *)local_60);
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  QMultiMap<QObject_*,_Qt::GestureType>::QMultiMap
            ((QMultiMap<QObject_*,_Qt::GestureType> *)0x30a755);
  QGraphicsItem::d_func((QGraphicsItem *)0x30a76d);
  bVar2 = QMap<Qt::GestureType,_QFlags<Qt::GestureFlag>_>::isEmpty
                    ((QMap<Qt::GestureType,_QFlags<Qt::GestureFlag>_> *)
                     CONCAT17(in_stack_ffffffffffffff27,
                              CONCAT16(in_stack_ffffffffffffff26,in_stack_ffffffffffffff20)));
  if (!bVar2) {
    local_70._M_node = (_Base_ptr)&DAT_aaaaaaaaaaaaaaaa;
    QGraphicsItem::d_func((QGraphicsItem *)0x30a79e);
    local_70._M_node =
         (_Base_ptr)
         QMap<Qt::GestureType,_QFlags<Qt::GestureFlag>_>::constBegin
                   ((QMap<Qt::GestureType,_QFlags<Qt::GestureFlag>_> *)
                    CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    local_78._M_node = (_Base_ptr)&DAT_aaaaaaaaaaaaaaaa;
    QGraphicsItem::d_func((QGraphicsItem *)0x30a7cc);
    local_78._M_node =
         (_Base_ptr)
         QMap<Qt::GestureType,_QFlags<Qt::GestureFlag>_>::constEnd
                   ((QMap<Qt::GestureType,_QFlags<Qt::GestureFlag>_> *)
                    CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    while (bVar2 = ::operator!=((const_iterator *)
                                CONCAT17(in_stack_ffffffffffffff27,
                                         CONCAT16(in_stack_ffffffffffffff26,
                                                  in_stack_ffffffffffffff20)),
                                (const_iterator *)
                                CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18)),
          bVar2) {
      QMap<Qt::GestureType,_QFlags<Qt::GestureFlag>_>::const_iterator::key
                ((const_iterator *)0x30a7ff);
      QVarLengthArray<Qt::GestureType,_16LL>::push_back
                ((QVarLengthArray<Qt::GestureType,_16LL> *)
                 CONCAT17(in_stack_ffffffffffffff27,
                          CONCAT16(in_stack_ffffffffffffff26,in_stack_ffffffffffffff20)),
                 (GestureType *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
      QMap<Qt::GestureType,_QFlags<Qt::GestureFlag>_>::const_iterator::key
                ((const_iterator *)0x30a823);
      in_stack_ffffffffffffff38._M_node =
           (_Base_ptr)
           QMultiMap<QObject_*,_Qt::GestureType>::insert
                     (in_RDX,in_RSI,&(in_stack_ffffffffffffff38._M_node)->_M_color);
      QMap<Qt::GestureType,_QFlags<Qt::GestureFlag>_>::const_iterator::operator++
                ((const_iterator *)
                 CONCAT17(in_stack_ffffffffffffff27,
                          CONCAT16(in_stack_ffffffffffffff26,in_stack_ffffffffffffff20)));
    }
  }
  key = QGraphicsItem::parentObject((QGraphicsItem *)in_stack_ffffffffffffff30._M_node);
  while (key != (QGraphicsObject *)0x0) {
    local_88._M_node = (_Base_ptr)&DAT_aaaaaaaaaaaaaaaa;
    QGraphicsItem::d_func((QGraphicsItem *)0x30a884);
    local_88._M_node =
         (_Base_ptr)
         QMap<Qt::GestureType,_QFlags<Qt::GestureFlag>_>::constBegin
                   ((QMap<Qt::GestureType,_QFlags<Qt::GestureFlag>_> *)
                    CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    local_90._M_node = (_Base_ptr)&DAT_aaaaaaaaaaaaaaaa;
    QGraphicsItem::d_func((QGraphicsItem *)0x30a8b2);
    local_90._M_node =
         (_Base_ptr)
         QMap<Qt::GestureType,_QFlags<Qt::GestureFlag>_>::constEnd
                   ((QMap<Qt::GestureType,_QFlags<Qt::GestureFlag>_> *)
                    CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    while (bVar2 = ::operator!=((const_iterator *)
                                CONCAT17(in_stack_ffffffffffffff27,
                                         CONCAT16(in_stack_ffffffffffffff26,
                                                  in_stack_ffffffffffffff20)),
                                (const_iterator *)
                                CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18)),
          bVar2) {
      QMap<Qt::GestureType,_QFlags<Qt::GestureFlag>_>::const_iterator::value
                ((const_iterator *)0x30a8e8);
      local_94.super_QFlagsStorage<Qt::GestureFlag>.i =
           (QFlagsStorage<Qt::GestureFlag>)
           QFlags<Qt::GestureFlag>::operator&
                     ((QFlags<Qt::GestureFlag> *)
                      CONCAT17(in_stack_ffffffffffffff27,
                               CONCAT16(in_stack_ffffffffffffff26,in_stack_ffffffffffffff20)),
                      in_stack_ffffffffffffff1c);
      bVar2 = QFlags<Qt::GestureFlag>::operator!((QFlags<Qt::GestureFlag> *)&local_94);
      if (bVar2) {
        QMap<Qt::GestureType,_QFlags<Qt::GestureFlag>_>::const_iterator::key
                  ((const_iterator *)0x30a913);
        bVar2 = QVLABase<Qt::GestureType>::contains<Qt::GestureType>
                          ((QVLABase<Qt::GestureType> *)in_stack_ffffffffffffff38._M_node,
                           &(in_stack_ffffffffffffff30._M_node)->_M_color);
        if (!bVar2) {
          QMap<Qt::GestureType,_QFlags<Qt::GestureFlag>_>::const_iterator::key
                    ((const_iterator *)0x30a931);
          QVarLengthArray<Qt::GestureType,_16LL>::push_back
                    ((QVarLengthArray<Qt::GestureType,_16LL> *)
                     CONCAT17(in_stack_ffffffffffffff27,
                              CONCAT16(in_stack_ffffffffffffff26,in_stack_ffffffffffffff20)),
                     (GestureType *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
          QMap<Qt::GestureType,_QFlags<Qt::GestureFlag>_>::const_iterator::key
                    ((const_iterator *)0x30a955);
          in_stack_ffffffffffffff30._M_node =
               (_Base_ptr)
               QMultiMap<QObject_*,_Qt::GestureType>::insert
                         (in_RDX,(QObject **)key,&(in_stack_ffffffffffffff38._M_node)->_M_color);
        }
      }
      QMap<Qt::GestureType,_QFlags<Qt::GestureFlag>_>::const_iterator::operator++
                ((const_iterator *)
                 CONCAT17(in_stack_ffffffffffffff27,
                          CONCAT16(in_stack_ffffffffffffff26,in_stack_ffffffffffffff20)));
    }
    key = QGraphicsItem::parentObject((QGraphicsItem *)in_stack_ffffffffffffff30._M_node);
  }
  bVar2 = QMultiMap<QObject_*,_Qt::GestureType>::isEmpty
                    ((QMultiMap<QObject_*,_Qt::GestureType> *)
                     CONCAT17(in_stack_ffffffffffffff27,
                              CONCAT16(in_stack_ffffffffffffff26,in_stack_ffffffffffffff20)));
  if (bVar2) {
    bVar3 = false;
  }
  else {
    bVar3 = filterEventThroughContexts
                      (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8
                      );
  }
  uVar4 = bVar3;
  QMultiMap<QObject_*,_Qt::GestureType>::~QMultiMap
            ((QMultiMap<QObject_*,_Qt::GestureType> *)0x30a9e5);
  QVarLengthArray<Qt::GestureType,_16LL>::~QVarLengthArray
            ((QVarLengthArray<Qt::GestureType,_16LL> *)
             CONCAT17(uVar4,CONCAT16(bVar3,in_stack_ffffffffffffff20)));
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (bool)(bVar3 & 1);
}

Assistant:

bool QGestureManager::filterEvent(QGraphicsObject *receiver, QEvent *event)
{
    QVarLengthArray<Qt::GestureType, 16> types;
    QMultiMap<QObject *, Qt::GestureType> contexts;
    QGraphicsObject *item = receiver;
    if (!item->QGraphicsItem::d_func()->gestureContext.isEmpty()) {
        typedef QMap<Qt::GestureType, Qt::GestureFlags>::const_iterator ContextIterator;
        for(ContextIterator it = item->QGraphicsItem::d_func()->gestureContext.constBegin(),
            e = item->QGraphicsItem::d_func()->gestureContext.constEnd(); it != e; ++it) {
            types.push_back(it.key());
            contexts.insert(item, it.key());
        }
    }
    // find all gesture contexts for the graphics object tree
    item = item->parentObject();
    while (item)
    {
        typedef QMap<Qt::GestureType, Qt::GestureFlags>::const_iterator ContextIterator;
        for (ContextIterator it = item->QGraphicsItem::d_func()->gestureContext.constBegin(),
             e = item->QGraphicsItem::d_func()->gestureContext.constEnd(); it != e; ++it) {
            if (!(it.value() & Qt::DontStartGestureOnChildren)) {
                if (!types.contains(it.key())) {
                    types.push_back(it.key());
                    contexts.insert(item, it.key());
                }
            }
        }
        item = item->parentObject();
    }
    return contexts.isEmpty() ? false : filterEventThroughContexts(contexts, event);
}